

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O1

Reals __thiscall
Omega_h::tri_vert_normal_weights(Omega_h *this,Mesh *mesh,Adj *surf_verts2tris,LOs *tri2surf_tri)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  element_type *peVar8;
  Alloc *pAVar9;
  char cVar10;
  Int i_2;
  LO LVar11;
  LO size_in;
  long lVar12;
  element_type **ppeVar13;
  long lVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar15;
  IntIterator last;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  Reals RVar20;
  Write<double> weights;
  Reals coords;
  LOs fv2v;
  type func;
  Matrix<3,_2> b;
  Few<int,_3> ffv2v;
  Vector<3> c;
  Matrix<3,_3> ffv2p;
  element_type *local_2b8 [4];
  element_type *local_298 [4];
  Write<double> local_278;
  Write<double> local_268;
  undefined1 local_258 [32];
  Alloc *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  Alloc *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  Alloc *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  Alloc *local_208;
  element_type *local_200;
  Alloc *local_1f8;
  element_type *local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  element_type *local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  Alloc *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  Alloc *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  Alloc *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  Alloc *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  Alloc *local_178;
  element_type *local_170;
  Alloc *local_168;
  element_type *local_160;
  element_type *local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  element_type *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  element_type *peStack_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  Alloc *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  Alloc *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  Alloc *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  Alloc *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  Alloc *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  Alloc *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  Alloc *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined4 local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined4 local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *peStack_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *local_68 [7];
  
  LVar11 = Graph::nnodes(&surf_verts2tris->super_Graph);
  Mesh::ask_verts_of((Mesh *)&local_1d8,(Int)mesh);
  Mesh::coords((Mesh *)&local_1e8);
  size_in = Graph::nedges(&surf_verts2tris->super_Graph);
  local_258._0_8_ = (Alloc *)(local_258 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  Write<double>::Write(&local_278,size_in,(string *)local_258);
  if ((Alloc *)local_258._0_8_ != (Alloc *)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
  }
  local_1c8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (surf_verts2tris->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_1c8._M_pi & 7) == 0 && (Alloc *)local_1c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (((Alloc *)local_1c8._M_pi)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_1c8._M_pi)->use_count = ((Alloc *)local_1c8._M_pi)->use_count + 1;
    }
  }
  local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (surf_verts2tris->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_1b8 = (surf_verts2tris->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (surf_verts2tris->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_1a8 = (surf_verts2tris->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (surf_verts2tris->codes).write_.shared_alloc_.direct_ptr;
  local_198 = (tri2surf_tri->write_).shared_alloc_.alloc;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (tri2surf_tri->write_).shared_alloc_.direct_ptr;
  local_188 = local_278.shared_alloc_.alloc;
  if (((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
      local_278.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)((local_278.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_278.shared_alloc_.alloc)->use_count = (local_278.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.shared_alloc_.direct_ptr;
  local_178 = (Alloc *)local_1d8._M_pi;
  if (((ulong)local_1d8._M_pi & 7) == 0 && (Alloc *)local_1d8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)((long)(local_1d8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1d8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1d8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_170 = local_1d0;
  local_168 = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)(local_1e8->size * 8 + 1);
    }
    else {
      local_1e8->use_count = local_1e8->use_count + 1;
    }
  }
  local_160 = local_1e0;
  local_128 = (Alloc *)local_1c8._M_pi;
  if (((ulong)local_1c8._M_pi & 7) == 0 && (Alloc *)local_1c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)((long)(local_1c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_118 = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_108 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_f8 = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_e8 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  _Stack_e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.shared_alloc_.direct_ptr;
  local_d8 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
  local_c8 = local_168;
  if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_168->size * 8 + 1);
    }
    else {
      local_168->use_count = local_168->use_count + 1;
    }
  }
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0;
  _Stack_120._M_pi = local_1c0;
  _Stack_110._M_pi = local_1b0;
  _Stack_100._M_pi = local_1a0;
  _Stack_f0._M_pi = local_190;
  if (0 < LVar11) {
    local_258._0_8_ = local_128;
    if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
      local_128->use_count = local_128->use_count + -1;
      local_258._0_8_ = local_128->size * 8 + 1;
    }
    local_128 = (Alloc *)0x0;
    _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_258._16_8_ = local_118;
    if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
      local_118->use_count = local_118->use_count + -1;
      local_258._16_8_ = local_118->size * 8 + 1;
    }
    local_118 = (Alloc *)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_238 = local_108;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_238 = (Alloc *)(local_108->size * 8 + 1);
    }
    local_108 = (Alloc *)0x0;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228 = local_f8;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      local_f8->use_count = local_f8->use_count + -1;
      local_228 = (Alloc *)(local_f8->size * 8 + 1);
    }
    local_f8 = (Alloc *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218 = local_e8;
    local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.shared_alloc_.direct_ptr;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_218 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_208 = local_d8;
    local_200 = local_1d0;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_208 = (Alloc *)(local_d8->size * 8 + 1);
    }
    local_d8 = (Alloc *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8 = local_c8;
    local_1f0 = local_1e0;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_1f8 = (Alloc *)(local_c8->size * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    lVar18 = 0;
    local_258._8_8_ = local_1c0;
    local_258._24_8_ = local_1b0;
    local_230 = local_1a0;
    local_220 = local_190;
    do {
      iVar4 = *(int *)((long)(_func_int ***)local_258._8_8_ + lVar18 * 4);
      lVar17 = (long)iVar4;
      if (iVar4 < *(int *)((long)(_func_int ***)local_258._8_8_ + lVar18 * 4 + 4)) {
        do {
          lVar12 = (long)*(int *)(local_258._24_8_ + lVar17 * 4);
          if (*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                              &local_220->_vptr__Sp_counted_base)->_M_ptr + lVar12 * 4) < 0) {
            (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
              &local_210->_vptr__Sp_counted_base)->_M_ptr)[lVar17] = (element_type *)0x0;
          }
          else {
            cVar10 = '\x03' - (*(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_230->_vptr__Sp_counted_base)->_M_ptr +
                                        lVar17) >> 3);
            local_a0._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_200->library_ + lVar12 * 0xc);
            local_98 = *(undefined4 *)
                        ((long)&(local_200->srcs_).write_.shared_alloc_.alloc + lVar12 * 0xc);
            lVar12 = 0;
            do {
              *(undefined4 *)
               ((long)&local_b0._M_pi +
               (long)(((int)cVar10 +
                       (((int)cVar10 / 3 + ((int)cVar10 >> 0x1f)) -
                       (int)((long)cVar10 * 0x55555556 >> 0x3f)) * -3 + (int)lVar12) % 3) * 4) =
                   *(undefined4 *)((long)&local_a0._M_pi + lVar12 * 4);
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_158 = (element_type *)local_b0._M_pi;
            uStack_150 = local_a8;
            lVar12 = 0;
            ppeVar13 = &local_78;
            do {
              lVar16 = (long)*(int *)((long)&local_158 + lVar12 * 4);
              ppeVar13[2] = *(element_type **)((long)&local_1f0->srcs_ + lVar16 * 0x18 + 8);
              puVar3 = (undefined8 *)((long)&local_1f0->library_ + lVar16 * 0x18);
              peVar8 = (element_type *)puVar3[1];
              *ppeVar13 = (element_type *)*puVar3;
              ppeVar13[1] = peVar8;
              lVar12 = lVar12 + 1;
              ppeVar13 = ppeVar13 + 3;
            } while (lVar12 != 3);
            lVar12 = 0;
            do {
              lVar16 = lVar12 + 1;
              local_2b8[2] = local_68[lVar16 * 3];
              local_2b8[0] = (&local_78)[lVar16 * 3];
              local_2b8[1] = local_68[lVar16 * 3 + -1];
              local_298[2] = local_68[0];
              local_298[0] = local_78;
              local_298[1] = (element_type *)_Stack_70._M_pi;
              lVar14 = 0;
              do {
                (&local_90)[lVar14]._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((double)local_2b8[lVar14] - (double)local_298[lVar14]);
                peVar8 = peStack_88;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              (&local_158)[lVar12 * 3] = (element_type *)local_90._M_pi;
              *(element_type **)(&uStack_150 + lVar12 * 6) = peVar8;
              (&local_148)[lVar12 * 3] = (element_type *)local_80._M_pi;
              bVar19 = lVar12 == 0;
              lVar12 = lVar16;
            } while (bVar19);
            local_298[0] = (element_type *)
                           ((double)CONCAT44(uStack_14c,uStack_150) * (double)local_130._M_pi -
                           (double)peStack_138 * (double)local_148);
            local_298[1] = (element_type *)
                           ((double)local_148 * (double)local_140._M_pi -
                           (double)local_130._M_pi * (double)local_158);
            local_298[2] = (element_type *)
                           ((double)local_158 * (double)peStack_138 -
                           (double)local_140._M_pi * (double)CONCAT44(uStack_14c,uStack_150));
            local_2b8[0] = local_298[0];
            local_2b8[1] = local_298[1];
            local_2b8[2] = local_298[2];
            dVar5 = (double)local_298[0] * (double)local_298[0];
            lVar12 = 1;
            do {
              dVar5 = dVar5 + (double)local_2b8[lVar12] * (double)local_298[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            if (dVar5 < 0.0) {
              dVar5 = sqrt(dVar5);
            }
            else {
              dVar5 = SQRT(dVar5);
            }
            local_298[2] = local_148;
            local_298[0] = local_158;
            local_298[1] = (element_type *)CONCAT44(uStack_14c,uStack_150);
            local_2b8[0] = local_158;
            local_2b8[1] = (element_type *)CONCAT44(uStack_14c,uStack_150);
            local_2b8[2] = local_148;
            dVar6 = (double)local_158 * (double)local_158;
            lVar12 = 1;
            do {
              dVar6 = dVar6 + (double)local_2b8[lVar12] * (double)local_298[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_298[2] = (element_type *)local_130._M_pi;
            local_298[0] = (element_type *)local_140._M_pi;
            local_298[1] = peStack_138;
            local_2b8[0] = (element_type *)local_140._M_pi;
            local_2b8[1] = peStack_138;
            local_2b8[2] = (element_type *)local_130._M_pi;
            dVar7 = (double)local_140._M_pi * (double)local_140._M_pi;
            lVar12 = 1;
            do {
              dVar7 = dVar7 + (double)local_2b8[lVar12] * (double)local_298[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
              &local_210->_vptr__Sp_counted_base)->_M_ptr)[lVar17] =
                 (element_type *)(dVar5 / (dVar6 * dVar7));
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)(_func_int ***)local_258._8_8_ + lVar18 * 4 + 4));
      }
      lVar18 = lVar18 + 1;
    } while (LVar11 != (int)lVar18);
    tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)local_258);
  }
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_128);
  local_268.shared_alloc_.alloc = local_278.shared_alloc_.alloc;
  local_268.shared_alloc_.direct_ptr = local_278.shared_alloc_.direct_ptr;
  if ((((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
       local_278.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_278.shared_alloc_.alloc)->use_count = (local_278.shared_alloc_.alloc)->use_count + -1;
    local_268.shared_alloc_.alloc = (Alloc *)((local_278.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_278.shared_alloc_.alloc = (Alloc *)0x0;
  local_278.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_268);
  pAVar9 = local_268.shared_alloc_.alloc;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.shared_alloc_.alloc);
      operator_delete(pAVar9,0x48);
    }
  }
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_1c8);
  pAVar9 = local_278.shared_alloc_.alloc;
  pvVar15 = extraout_RDX;
  if (((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
      local_278.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_278.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278.shared_alloc_.alloc);
      operator_delete(pAVar9,0x48);
      pvVar15 = extraout_RDX_00;
    }
  }
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    piVar1 = &local_1e8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e8);
      operator_delete(local_1e8,0x48);
      pvVar15 = extraout_RDX_01;
    }
  }
  if (((ulong)local_1d8._M_pi & 7) == 0 && (Alloc *)local_1d8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_1d8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_1d8._M_pi);
      operator_delete(local_1d8._M_pi,0x48);
      pvVar15 = extraout_RDX_02;
    }
  }
  RVar20.write_.shared_alloc_.direct_ptr = pvVar15;
  RVar20.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar20.write_.shared_alloc_;
}

Assistant:

Reals tri_vert_normal_weights(
    Mesh* mesh, Adj surf_verts2tris, LOs tri2surf_tri) {
  auto nsurf_verts = surf_verts2tris.nnodes();
  auto fv2v = mesh->ask_verts_of(FACE);
  auto coords = mesh->coords();
  auto nweights = surf_verts2tris.nedges();
  auto weights = Write<Real>(nweights);
  auto func = OMEGA_H_LAMBDA(LO surf_vert) {
    for (auto vf = surf_verts2tris.a2ab[surf_vert];
         vf < surf_verts2tris.a2ab[surf_vert + 1]; ++vf) {
      auto f = surf_verts2tris.ab2b[vf];
      if (tri2surf_tri[f] < 0) {
        weights[vf] = 0.0;
        continue;
      }
      auto code = surf_verts2tris.codes[vf];
      auto ffv = code_which_down(code);
      auto rot = rotation_to_first(3, ffv);
      auto ffv2v_0 = gather_verts<3>(fv2v, f);
      Few<LO, 3> ffv2v;
      rotate_adj<3>(rot, ffv2v_0, 0, ffv2v, 0);
      auto ffv2p = gather_vectors<3, 3>(coords, ffv2v);
      auto b = simplex_basis<3, 2>(ffv2p);
      auto w =
          norm(cross(b[0], b[1])) / (norm_squared(b[0]) * norm_squared(b[1]));
      weights[vf] = w;
    }
  };
  parallel_for(nsurf_verts, func, "tri_vert_normal_weights");
  return weights;
}